

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::MaybeTripleQuotedString(AsciiParser *this,StringData *str)

{
  uint8_t uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  char *pcVar5;
  bool bVar6;
  StreamReader *pSVar7;
  ulong uVar8;
  int iVar9;
  string s;
  vector<char,_std::allocator<char>_> triple_quote;
  stringstream str_buf;
  stringstream ss;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  bool local_3bc;
  string local_3b8;
  vector<char,_std::allocator<char>_> local_398;
  Cursor local_378;
  undefined8 uStack_370;
  string local_360;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  uVar2 = this->_sr->idx_;
  local_378 = this->_curr_cursor;
  uStack_370 = 0;
  local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar6 = CharN(this,3,&local_398);
  if ((bVar6) &&
     ((long)local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start == 3)) {
    if (*local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start == '\'') {
      if ((local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start[1] != '\'') ||
         (local_3bc = true,
         local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[2] != '\'')) goto LAB_00388474;
    }
    else {
      if ((*local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != '\"') ||
         ((local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start[1] != '\"' ||
          (local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start[2] != '\"')))) goto LAB_00388474;
      local_3bc = false;
    }
    ::std::__cxx11::stringstream::stringstream(local_340);
    pSVar7 = this->_sr;
    uVar8 = pSVar7->idx_;
    if (uVar8 < pSVar7->length_) {
      local_3c0 = (this->_curr_cursor).row;
      iVar9 = (this->_curr_cursor).col;
      local_3c4 = 0;
      local_3c8 = 0;
      do {
        uVar1 = pSVar7->binary_[uVar8];
        if (uVar1 == '\0') break;
        pSVar7->idx_ = uVar8 + 1;
        if (uVar1 == '\\') {
          local_3b8._M_dataplus._M_p = (pointer)0x0;
          local_3b8._M_string_length = 0;
          local_3b8.field_2._M_allocated_capacity = 0;
          local_3b8._M_dataplus._M_p = (pointer)operator_new(3);
          local_3b8._M_string_length = (size_type)(local_3b8._M_dataplus._M_p + 3);
          local_3b8._M_dataplus._M_p[0] = '\0';
          local_3b8._M_dataplus._M_p[1] = '\0';
          local_3b8._M_dataplus._M_p[2] = '\0';
          local_3b8.field_2._M_allocated_capacity = local_3b8._M_string_length;
          bVar6 = LookCharN(this,3,(vector<char,_std::allocator<char>_> *)&local_3b8);
          if (bVar6) {
            if (*local_3b8._M_dataplus._M_p == '\"') {
              bVar6 = false;
              bVar4 = true;
              if ((local_3b8._M_dataplus._M_p[1] == '\"') && (local_3b8._M_dataplus._M_p[2] == '\"')
                 ) {
                pcVar5 = "\\\"\"\"";
LAB_0038837b:
                ::std::__ostream_insert<char,std::char_traits<char>>(local_330,pcVar5 + 1,3);
                pSVar7 = this->_sr;
                if ((-4 < (long)pSVar7->idx_) &&
                   (uVar8 = pSVar7->idx_ + 3, uVar8 <= pSVar7->length_)) {
                  pSVar7->idx_ = uVar8;
                }
                iVar9 = iVar9 + 3;
                bVar6 = false;
                goto LAB_003882d0;
              }
              goto LAB_003882d3;
            }
            if (*local_3b8._M_dataplus._M_p == '\'') {
              bVar6 = false;
              bVar4 = true;
              if ((local_3b8._M_dataplus._M_p[1] == '\'') && (local_3b8._M_dataplus._M_p[2] == '\'')
                 ) {
                pcVar5 = "\\\'\'\'";
                goto LAB_0038837b;
              }
              goto LAB_003882d3;
            }
            operator_delete(local_3b8._M_dataplus._M_p,
                            local_3b8.field_2._M_allocated_capacity -
                            (long)local_3b8._M_dataplus._M_p);
LAB_003883b6:
            local_3b8._M_dataplus._M_p._0_1_ = 0x5c;
            ::std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)&local_3b8,1);
LAB_003883cd:
            local_3c4 = 0;
            goto LAB_003883d7;
          }
          bVar6 = true;
LAB_003882d0:
          bVar4 = false;
LAB_003882d3:
          if (local_3b8._M_dataplus._M_p != (char *)0x0) {
            operator_delete(local_3b8._M_dataplus._M_p,
                            local_3b8.field_2._M_allocated_capacity -
                            (long)local_3b8._M_dataplus._M_p);
          }
          if (bVar4) goto LAB_003883b6;
          if (bVar6) goto LAB_003884dc;
        }
        else {
          local_3b8._M_dataplus._M_p._0_1_ = uVar1;
          ::std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)&local_3b8,1);
          if (uVar1 != '\"') {
            if (uVar1 == '\'') {
              local_3c8 = local_3c8 + 1;
              if (local_3c8 == 3) goto LAB_00388501;
              local_3c4 = 0;
              iVar9 = iVar9 + 1;
              goto LAB_003883de;
            }
            if (uVar1 != '\r') {
              if (uVar1 == '\n') goto LAB_0038845a;
              goto LAB_003883cd;
            }
            pSVar7 = this->_sr;
            uVar8 = pSVar7->length_;
            uVar3 = pSVar7->idx_;
            if (uVar3 < uVar8 - 1) {
              if (uVar8 <= uVar3) {
LAB_003885ad:
                if (uVar8 < uVar2) goto LAB_003884dc;
                goto LAB_003884d8;
              }
              uVar1 = pSVar7->binary_[uVar3];
              pSVar7->idx_ = uVar3 + 1;
              if (uVar1 == '\n') {
                local_3b8._M_dataplus._M_p._0_1_ = 10;
                ::std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)&local_3b8,1)
                ;
              }
              else {
                if (0x7ffffffffffffffe < uVar3) goto LAB_003885ad;
                pSVar7->idx_ = uVar3;
              }
            }
LAB_0038845a:
            local_3c0 = local_3c0 + 1;
            local_3c4 = 0;
            local_3c8 = 0;
            iVar9 = 0;
            goto LAB_003883de;
          }
          local_3c4 = local_3c4 + 1;
          if (local_3c4 == 3 && local_3bc == false) {
LAB_00388501:
            str->single_quote = local_3bc;
            ::std::__cxx11::stringbuf::str();
            if ((char *)0x3 < local_3b8._M_string_length) {
              (local_3b8._M_dataplus._M_p + -3)[local_3b8._M_string_length] = '\0';
              local_3b8._M_string_length = (size_type)(local_3b8._M_string_length + -3);
            }
            unescapeControlSequence(&local_360,&local_3b8);
            ::std::__cxx11::string::operator=((string *)str,(string *)&local_360);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            str->line_row = local_378.row;
            str->line_col = local_378.col;
            str->is_triple_quoted = true;
            (this->_curr_cursor).row = local_3c0;
            (this->_curr_cursor).col = iVar9 + 1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
              operator_delete(local_3b8._M_dataplus._M_p,
                              (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
            }
            bVar6 = true;
            goto LAB_003884de;
          }
LAB_003883d7:
          local_3c8 = 0;
          iVar9 = iVar9 + 1;
        }
LAB_003883de:
        pSVar7 = this->_sr;
        uVar8 = pSVar7->idx_;
      } while (uVar8 < pSVar7->length_);
    }
    pSVar7 = this->_sr;
    if (uVar2 <= pSVar7->length_) {
LAB_003884d8:
      pSVar7->idx_ = uVar2;
    }
LAB_003884dc:
    bVar6 = false;
LAB_003884de:
    ::std::__cxx11::stringstream::~stringstream(local_340);
    ::std::ios_base::~ios_base(local_2c0);
  }
  else {
LAB_00388474:
    if (uVar2 <= this->_sr->length_) {
      this->_sr->idx_ = uVar2;
    }
    bVar6 = false;
  }
  if (local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar6;
}

Assistant:

bool AsciiParser::MaybeTripleQuotedString(value::StringData *str) {
  std::stringstream ss;

  auto loc = CurrLoc();
  auto start_cursor = _curr_cursor;

  std::vector<char> triple_quote;
  if (!CharN(3, &triple_quote)) {
    SeekTo(loc);
    return false;
  }

  if (triple_quote.size() != 3) {
    SeekTo(loc);
    return false;
  }

  bool single_quote = false;

  if (triple_quote[0] == '"' && triple_quote[1] == '"' &&
      triple_quote[2] == '"') {
    // ok
  } else if (triple_quote[0] == '\'' && triple_quote[1] == '\'' &&
             triple_quote[2] == '\'') {
    // ok
    single_quote = true;
  } else {
    SeekTo(loc);
    return false;
  }

  // Read until next triple-quote `"""` or "'''"
  std::stringstream str_buf;

  auto locinfo = _curr_cursor;

  int single_quote_count = 0;  // '
  int double_quote_count = 0;  // "

  bool got_closing_triple_quote{false};

  while (!Eof()) {
    char c;

    if (!Char1(&c)) {
      SeekTo(loc);
      return false;
    }

    // Seek \""" or \'''
    // Unescape '\'
    if (c == '\\') {
      std::vector<char> buf(3, '\0');
      if (!LookCharN(3, &buf)) {
        // at least 3 chars should be read
        return false;
      }

      if (buf[0] == '\'' && buf[1] == '\'' && buf[2] == '\'') {
        str_buf << "'''";
        // advance
        _sr->seek_from_current(3);
        locinfo.col += 3;
        continue;
      } else if (buf[0] == '"' && buf[1] == '"' && buf[2] == '"') {
        str_buf << "\"\"\"";
        // advance
        _sr->seek_from_current(3);
        locinfo.col += 3;
        continue;
      }
    }

    str_buf << c;

    if (c == '"') {
      double_quote_count++;
      single_quote_count = 0;
    } else if (c == '\'') {
      double_quote_count = 0;
      single_quote_count++;
    } else {
      double_quote_count = 0;
      single_quote_count = 0;
    }

    // Update loc info
    locinfo.col++;
    if (c == '\n') {
      locinfo.col = 0;
      locinfo.row++;
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          SeekTo(loc);
          return false;
        }

        if (d == '\n') {
          // CRLF
          str_buf << d;
        } else {
          // unwind 1 char
          if (!_sr->seek_from_current(-1)) {
            // this should not happen.
            SeekTo(loc);
            return false;
          }
        }
      }
      locinfo.col = 0;
      locinfo.row++;
    }

    if (double_quote_count == 3) {
      // got '"""'
      if (single_quote) {
        // continue
      } else {
        got_closing_triple_quote = true;
        break;
      }
    }
    if (single_quote_count == 3) {
      // got '''
      if (double_quote_count) {
        // continue
      } else {
        got_closing_triple_quote = true;
        break;
      }
    }
  }

  if (!got_closing_triple_quote) {
    SeekTo(loc);
    return false;
  }

  DCOUT("single_quote = " << single_quote);
  DCOUT("Triple quoted string found. col " << start_cursor.col << ", row "
                                           << start_cursor.row);

  // remove last '"""' or '''
  str->single_quote = single_quote;
  std::string s = str_buf.str();
  if (s.size() > 3) {  // just in case
    s.erase(s.size() - 3);
  }

  DCOUT("str = " << s);

  str->value = unescapeControlSequence(s);

  DCOUT("unescape str = " << str->value);

  str->line_col = start_cursor.col;
  str->line_row = start_cursor.row;
  str->is_triple_quoted = true;

  _curr_cursor = locinfo;

  return true;
}